

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dispatcher.cpp
# Opt level: O2

void __thiscall cppnet::Dispatcher::~Dispatcher(Dispatcher *this)

{
  pthread_t pVar1;
  
  (this->super_Thread)._vptr_Thread = (_func_int **)&PTR__Dispatcher_00126f98;
  pVar1 = pthread_self();
  if (pVar1 != (this->_local_thread_id)._M_thread) {
    LOCK();
    (this->super_Thread)._stop._M_base._M_i = true;
    UNLOCK();
    (*((this->_event_actions).super___shared_ptr<cppnet::EventActions,_(__gnu_cxx::_Lock_policy)2>.
      _M_ptr)->_vptr_EventActions[0xb])();
    (*(this->super_Thread)._vptr_Thread[4])(this);
  }
  std::__weak_count<(__gnu_cxx::_Lock_policy)2>::~__weak_count
            (&(this->_cppnet_base).super___weak_ptr<cppnet::CppNetBase,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&(this->_event_actions).
              super___shared_ptr<cppnet::EventActions,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&(this->_timer).super___shared_ptr<cppnet::Timer,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::vector<std::function<void_()>,_std::allocator<std::function<void_()>_>_>::~vector
            (&this->_task_list);
  std::__weak_count<(__gnu_cxx::_Lock_policy)2>::~__weak_count
            (&(this->super_enable_shared_from_this<cppnet::Dispatcher>)._M_weak_this.
              super___weak_ptr<cppnet::Dispatcher,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  Thread::~Thread(&this->super_Thread);
  return;
}

Assistant:

Dispatcher::~Dispatcher() {
    if (std::this_thread::get_id() != _local_thread_id) {
        Stop();
        Join();
    }
}